

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

bool __thiscall
llvm::
DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
::LookupBucketFor<unsigned_short>
          (DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
           *this,unsigned_short *Val,DenseSetPair<unsigned_short> **FoundBucket)

{
  DenseSetPair<unsigned_short> **LHS;
  bool bVar1;
  bool bVar2;
  unsigned_short *puVar3;
  DenseSetPair<unsigned_short> *local_78;
  DenseSetPair<unsigned_short> *ThisBucket;
  uint local_48;
  uint ProbeAmt;
  uint BucketNo;
  unsigned_short TombstoneKey;
  unsigned_short EmptyKey;
  DenseSetPair<unsigned_short> *FoundTombstone;
  DenseSetPair<unsigned_short> *pDStack_30;
  uint NumBuckets;
  DenseSetPair<unsigned_short> *BucketsPtr;
  DenseSetPair<unsigned_short> **FoundBucket_local;
  unsigned_short *Val_local;
  DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
  *this_local;
  
  BucketsPtr = (DenseSetPair<unsigned_short> *)FoundBucket;
  FoundBucket_local = (DenseSetPair<unsigned_short> **)Val;
  Val_local = (unsigned_short *)this;
  pDStack_30 = getBuckets(this);
  FoundTombstone._4_4_ = getNumBuckets(this);
  if (FoundTombstone._4_4_ == 0) {
    *(undefined8 *)BucketsPtr = 0;
    this_local._7_1_ = false;
  }
  else {
    _BucketNo = (DenseSetPair<unsigned_short> *)0x0;
    ProbeAmt._2_2_ = getEmptyKey();
    ProbeAmt._0_2_ = getTombstoneKey();
    bVar1 = DenseMapInfo<unsigned_short>::isEqual
                      ((unsigned_short *)FoundBucket_local,(unsigned_short *)((long)&ProbeAmt + 2));
    bVar2 = false;
    if (!bVar1) {
      bVar1 = DenseMapInfo<unsigned_short>::isEqual
                        ((unsigned_short *)FoundBucket_local,(unsigned_short *)&ProbeAmt);
      bVar2 = false;
      if (!bVar1) {
        bVar2 = true;
      }
    }
    if (!bVar2) {
      __assert_fail("!KeyInfoT::isEqual(Val, EmptyKey) && !KeyInfoT::isEqual(Val, TombstoneKey) && \"Empty/Tombstone value shouldn\'t be inserted into map!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                    ,0x252,
                    "bool llvm::DenseMapBase<llvm::SmallDenseMap<unsigned short, llvm::detail::DenseSetEmpty, 4, llvm::DenseMapInfo<unsigned short>, llvm::detail::DenseSetPair<unsigned short>>, unsigned short, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<unsigned short>, llvm::detail::DenseSetPair<unsigned short>>::LookupBucketFor(const LookupKeyT &, const BucketT *&) const [DerivedT = llvm::SmallDenseMap<unsigned short, llvm::detail::DenseSetEmpty, 4, llvm::DenseMapInfo<unsigned short>, llvm::detail::DenseSetPair<unsigned short>>, KeyT = unsigned short, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DenseMapInfo<unsigned short>, BucketT = llvm::detail::DenseSetPair<unsigned short>, LookupKeyT = unsigned short]"
                   );
    }
    local_48 = getHashValue((unsigned_short *)FoundBucket_local);
    local_48 = local_48 & FoundTombstone._4_4_ - 1;
    ThisBucket._4_4_ = 1;
    while( true ) {
      LHS = FoundBucket_local;
      local_78 = pDStack_30 + local_48;
      puVar3 = detail::DenseSetPair<unsigned_short>::getFirst(local_78);
      bVar2 = DenseMapInfo<unsigned_short>::isEqual((unsigned_short *)LHS,puVar3);
      if (bVar2) break;
      puVar3 = detail::DenseSetPair<unsigned_short>::getFirst(local_78);
      bVar2 = DenseMapInfo<unsigned_short>::isEqual(puVar3,(unsigned_short *)((long)&ProbeAmt + 2));
      if (bVar2) {
        if (_BucketNo != (DenseSetPair<unsigned_short> *)0x0) {
          local_78 = _BucketNo;
        }
        *(DenseSetPair<unsigned_short> **)BucketsPtr = local_78;
        return false;
      }
      puVar3 = detail::DenseSetPair<unsigned_short>::getFirst(local_78);
      bVar2 = DenseMapInfo<unsigned_short>::isEqual(puVar3,(unsigned_short *)&ProbeAmt);
      if ((bVar2) && (_BucketNo == (DenseSetPair<unsigned_short> *)0x0)) {
        _BucketNo = local_78;
      }
      local_48 = FoundTombstone._4_4_ - 1 & ThisBucket._4_4_ + local_48;
      ThisBucket._4_4_ = ThisBucket._4_4_ + 1;
    }
    *(DenseSetPair<unsigned_short> **)BucketsPtr = local_78;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool LookupBucketFor(const LookupKeyT &Val,
                       const BucketT *&FoundBucket) const {
    const BucketT *BucketsPtr = getBuckets();
    const unsigned NumBuckets = getNumBuckets();

    if (NumBuckets == 0) {
      FoundBucket = nullptr;
      return false;
    }

    // FoundTombstone - Keep track of whether we find a tombstone while probing.
    const BucketT *FoundTombstone = nullptr;
    const KeyT EmptyKey = getEmptyKey();
    const KeyT TombstoneKey = getTombstoneKey();
    assert(!KeyInfoT::isEqual(Val, EmptyKey) &&
           !KeyInfoT::isEqual(Val, TombstoneKey) &&
           "Empty/Tombstone value shouldn't be inserted into map!");

    unsigned BucketNo = getHashValue(Val) & (NumBuckets-1);
    unsigned ProbeAmt = 1;
    while (true) {
      const BucketT *ThisBucket = BucketsPtr + BucketNo;
      // Found Val's bucket?  If so, return it.
      if (LLVM_LIKELY(KeyInfoT::isEqual(Val, ThisBucket->getFirst()))) {
        FoundBucket = ThisBucket;
        return true;
      }

      // If we found an empty bucket, the key doesn't exist in the set.
      // Insert it and return the default value.
      if (LLVM_LIKELY(KeyInfoT::isEqual(ThisBucket->getFirst(), EmptyKey))) {
        // If we've already seen a tombstone while probing, fill it in instead
        // of the empty bucket we eventually probed to.
        FoundBucket = FoundTombstone ? FoundTombstone : ThisBucket;
        return false;
      }

      // If this is a tombstone, remember it.  If Val ends up not in the map, we
      // prefer to return it than something that would require more probing.
      if (KeyInfoT::isEqual(ThisBucket->getFirst(), TombstoneKey) &&
          !FoundTombstone)
        FoundTombstone = ThisBucket;  // Remember the first tombstone found.

      // Otherwise, it's a hash collision or a tombstone, continue quadratic
      // probing.
      BucketNo += ProbeAmt++;
      BucketNo &= (NumBuckets-1);
    }
  }